

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O1

int nni_listener_create(nni_listener **lp,nni_sock *s,char *url_str)

{
  int iVar1;
  nni_sp_tran *tran;
  nni_listener *l;
  size_t sz;
  
  tran = nni_sp_tran_find(url_str);
  iVar1 = 9;
  if ((tran != (nni_sp_tran *)0x0) && (tran->tran_listener != (nni_sp_listener_ops *)0x0)) {
    sz = tran->tran_listener->l_size + 0x858;
    l = (nni_listener *)nni_zalloc(sz);
    if (l == (nni_listener *)0x0) {
      iVar1 = 2;
    }
    else {
      iVar1 = nni_url_parse_inline(&l->l_url,url_str);
      if (iVar1 == 0) {
        iVar1 = nni_listener_init(l,s,tran);
        if (iVar1 == 0) {
          *lp = l;
          iVar1 = 0;
        }
        else {
          nni_listener_destroy(l);
        }
      }
      else {
        nni_free(l,sz);
      }
    }
  }
  return iVar1;
}

Assistant:

int
nni_listener_create(nni_listener **lp, nni_sock *s, const char *url_str)
{
	nni_sp_tran  *tran;
	nni_listener *l;
	int           rv;
	size_t        sz;

	if (((tran = nni_sp_tran_find(url_str)) == NULL) ||
	    (tran->tran_listener == NULL)) {
		return (NNG_ENOTSUP);
	}
	sz = NNI_ALIGN_UP(sizeof(*l)) + tran->tran_listener->l_size;
	if ((l = nni_zalloc(sz)) == NULL) {
		return (NNG_ENOMEM);
	}

	if ((rv = nni_url_parse_inline(&l->l_url, url_str)) != 0) {
		nni_free(l, sz);
		return (rv);
	}
	if ((rv = nni_listener_init(l, s, tran)) != 0) {
		nni_listener_destroy(l);
		return (rv);
	}
	*lp = l;
	return (0);
}